

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void load_buffer_and_flip_round_shift(int16_t *in,int stride,__m128i *out,int bit)

{
  undefined1 auVar1 [16];
  uint in_ECX;
  undefined1 (*in_RDX) [16];
  int in_ESI;
  int16_t *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  
  load_16bit_to_16bit(in_RDI);
  *(undefined8 *)in_RDX[7] = in_XMM0_Qa;
  *(undefined8 *)(in_RDX[7] + 8) = in_XMM0_Qb;
  load_16bit_to_16bit(in_RDI + in_ESI);
  *(undefined8 *)in_RDX[6] = in_XMM0_Qa;
  *(undefined8 *)(in_RDX[6] + 8) = in_XMM0_Qb;
  load_16bit_to_16bit(in_RDI + (in_ESI << 1));
  *(undefined8 *)in_RDX[5] = in_XMM0_Qa;
  *(undefined8 *)(in_RDX[5] + 8) = in_XMM0_Qb;
  load_16bit_to_16bit(in_RDI + in_ESI * 3);
  *(undefined8 *)in_RDX[4] = in_XMM0_Qa;
  *(undefined8 *)(in_RDX[4] + 8) = in_XMM0_Qb;
  load_16bit_to_16bit(in_RDI + (in_ESI << 2));
  *(undefined8 *)in_RDX[3] = in_XMM0_Qa;
  *(undefined8 *)(in_RDX[3] + 8) = in_XMM0_Qb;
  load_16bit_to_16bit(in_RDI + in_ESI * 5);
  *(undefined8 *)in_RDX[2] = in_XMM0_Qa;
  *(undefined8 *)(in_RDX[2] + 8) = in_XMM0_Qb;
  load_16bit_to_16bit(in_RDI + in_ESI * 6);
  *(undefined8 *)in_RDX[1] = in_XMM0_Qa;
  *(undefined8 *)(in_RDX[1] + 8) = in_XMM0_Qb;
  load_16bit_to_16bit(in_RDI + in_ESI * 7);
  *(undefined8 *)*in_RDX = in_XMM0_Qa;
  *(undefined8 *)(*in_RDX + 8) = in_XMM0_Qb;
  auVar1 = vpsllw_avx(in_RDX[7],ZEXT416(in_ECX));
  in_RDX[7] = auVar1;
  auVar1 = vpsllw_avx(in_RDX[6],ZEXT416(in_ECX));
  in_RDX[6] = auVar1;
  auVar1 = vpsllw_avx(in_RDX[5],ZEXT416(in_ECX));
  in_RDX[5] = auVar1;
  auVar1 = vpsllw_avx(in_RDX[4],ZEXT416(in_ECX));
  in_RDX[4] = auVar1;
  auVar1 = vpsllw_avx(in_RDX[3],ZEXT416(in_ECX));
  in_RDX[3] = auVar1;
  auVar1 = vpsllw_avx(in_RDX[2],ZEXT416(in_ECX));
  in_RDX[2] = auVar1;
  auVar1 = vpsllw_avx(in_RDX[1],ZEXT416(in_ECX));
  in_RDX[1] = auVar1;
  auVar1 = vpsllw_avx(*in_RDX,ZEXT416(in_ECX));
  *in_RDX = auVar1;
  return;
}

Assistant:

static inline void load_buffer_and_flip_round_shift(const int16_t *in,
                                                    int stride, __m128i *out,
                                                    int bit) {
  out[7] = load_16bit_to_16bit(in + 0 * stride);
  out[6] = load_16bit_to_16bit(in + 1 * stride);
  out[5] = load_16bit_to_16bit(in + 2 * stride);
  out[4] = load_16bit_to_16bit(in + 3 * stride);
  out[3] = load_16bit_to_16bit(in + 4 * stride);
  out[2] = load_16bit_to_16bit(in + 5 * stride);
  out[1] = load_16bit_to_16bit(in + 6 * stride);
  out[0] = load_16bit_to_16bit(in + 7 * stride);
  out[7] = _mm_slli_epi16(out[7], bit);
  out[6] = _mm_slli_epi16(out[6], bit);
  out[5] = _mm_slli_epi16(out[5], bit);
  out[4] = _mm_slli_epi16(out[4], bit);
  out[3] = _mm_slli_epi16(out[3], bit);
  out[2] = _mm_slli_epi16(out[2], bit);
  out[1] = _mm_slli_epi16(out[1], bit);
  out[0] = _mm_slli_epi16(out[0], bit);
}